

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O2

PathTypeHandlerBase * __thiscall
Js::SimpleTypeHandler<1UL>::ConvertToPathType(SimpleTypeHandler<1UL> *this,DynamicObject *instance)

{
  DynamicType *pStrongReference;
  SimpleTypeHandler<1UL> *this_00;
  bool bVar1;
  anon_class_1_1_af1a6535 MarkAsFixed;
  PropertyTypes values;
  PathTypeHandlerBase *pPVar2;
  undefined7 extraout_var;
  DynamicType *pDVar3;
  Var aValue;
  PathTypeHandlerBase *this_01;
  RecyclerWeakReference<Js::DynamicType> *typeWeakRef;
  uint index_00;
  uint uVar4;
  PathTypeSuccessorKey local_78;
  PathTypeSuccessorKey local_70;
  Type *local_68;
  DynamicType *local_60;
  PropertyIndex local_52;
  SimpleTypeHandler<1UL> *pSStack_50;
  PropertyIndex index;
  uint local_48;
  undefined4 local_44;
  ScriptContext *local_40;
  PathTypeHandlerBase *local_38;
  uint local_2c;
  
  local_40 = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr;
  local_44 = 0;
  pSStack_50 = this;
  pPVar2 = &PathTypeHandlerNoAttr::New
                      (local_40,(((local_40->super_ScriptContextBase).javascriptLibrary)->rootPath).
                                ptr,0,(PropertyIndex)(this->super_DynamicTypeHandler).slotCapacity,
                       (this->super_DynamicTypeHandler).inlineSlotCapacity,
                       (this->super_DynamicTypeHandler).offsetOfInlineSlots,true,false,
                       (DynamicType *)0x0)->super_PathTypeHandlerBase;
  DynamicTypeHandler::SetMayBecomeShared(&pPVar2->super_DynamicTypeHandler);
  bVar1 = DynamicTypeHandler::ShouldFixAnyProperties();
  if (bVar1) {
    bVar1 = DynamicObject::HasLockedType(instance);
    local_44 = (undefined4)CONCAT71(extraout_var,bVar1);
  }
  local_60 = (DynamicType *)(instance->super_RecyclableObject).type.ptr;
  local_38 = pPVar2;
  pDVar3 = DynamicType::New(local_40,(local_60->super_Type).typeId,
                            (local_60->super_Type).prototype.ptr,(JavascriptMethod)0x0,
                            &pPVar2->super_DynamicTypeHandler,false,false);
  local_68 = pSStack_50->descriptors;
  local_2c = 0xffffffff;
  local_48 = 0;
  uVar4 = 0;
  while (pPVar2 = local_38, pStrongReference = local_60, index_00 = uVar4 & 0xffff,
        (int)index_00 < pSStack_50->propertyCount) {
    local_2c = *(uint *)(*(long *)((long)&(local_68->Id).ptr + (ulong)(index_00 << 4)) + 8);
    local_48 = *(byte *)((long)&local_68->field_1 + (ulong)(index_00 << 4)) & 0xf;
    PathTypeSuccessorKey::PathTypeSuccessorKey(&local_70,local_2c,(ObjectSlotAttributes)local_48);
    pDVar3 = PathTypeHandlerBase::PromoteType<false>
                       (local_38,pDVar3,local_70,false,local_40,instance,&local_52);
    local_38 = PathTypeHandlerBase::FromTypeHandler((pDVar3->typeHandler).ptr);
    aValue = DynamicObject::GetSlot(instance,index_00);
    MarkAsFixed.markAsFixed = false;
    if ((char)local_44 != '\0') {
      MarkAsFixed.markAsFixed = false;
      if ((0xf < local_2c) && (MarkAsFixed.markAsFixed = false, aValue != (Var)0x0)) {
        bVar1 = VarIs<Js::JavascriptFunction>(aValue);
        if (bVar1) {
          MarkAsFixed.markAsFixed = DynamicTypeHandler::ShouldFixMethodProperties();
        }
        else {
          MarkAsFixed.markAsFixed = false;
        }
      }
    }
    PathTypeHandlerBase::
    InitializePath<Js::SimpleTypeHandler<1ul>::ConvertToPathType(Js::DynamicObject*)::_lambda()_1_>
              (local_38,instance,(PropertyIndex)uVar4,
               (local_38->super_DynamicTypeHandler).unusedBytes >> 1,local_40,MarkAsFixed);
    uVar4 = index_00 + 1;
  }
  if (local_60->isLocked != false) {
    DynamicTypeHandler::LockTypeHandler(&local_38->super_DynamicTypeHandler);
  }
  if (pStrongReference->isShared == true) {
    DynamicTypeHandler::ShareTypeHandler(&pPVar2->super_DynamicTypeHandler,local_40);
  }
  this_00 = pSStack_50;
  DynamicTypeHandler::SetFlags
            (&pPVar2->super_DynamicTypeHandler,(pSStack_50->super_DynamicTypeHandler).flags & 0x22);
  values = DynamicTypeHandler::GetPropertyTypes(&this_00->super_DynamicTypeHandler);
  DynamicTypeHandler::SetPropertyTypes(&pPVar2->super_DynamicTypeHandler,0xb0,values);
  DynamicTypeHandler::SetInstanceTypeHandler(&pPVar2->super_DynamicTypeHandler,instance,false);
  pDVar3 = (pPVar2->predecessorType).ptr;
  if (pDVar3 != (DynamicType *)0x0) {
    this_01 = PathTypeHandlerBase::FromTypeHandler((pDVar3->typeHandler).ptr);
    pDVar3 = (local_38->predecessorType).ptr;
    PathTypeSuccessorKey::PathTypeSuccessorKey(&local_78,local_2c,(ObjectSlotAttributes)local_48);
    typeWeakRef = Memory::Recycler::CreateWeakReferenceHandle<Js::DynamicType>
                            (local_40->recycler,pStrongReference);
    pPVar2 = local_38;
    PathTypeHandlerBase::ReplaceSuccessor(this_01,pDVar3,local_78,typeWeakRef);
  }
  return pPVar2;
}

Assistant:

PathTypeHandlerBase* SimpleTypeHandler<size>::ConvertToPathType(DynamicObject* instance)
    {
        ScriptContext *scriptContext = instance->GetScriptContext();
        PathTypeHandlerBase* newTypeHandler =
            PathTypeHandlerNoAttr::New(
                scriptContext,
                scriptContext->GetLibrary()->GetRootPath(),
                0,
                static_cast<PropertyIndex>(this->GetSlotCapacity()),
                this->GetInlineSlotCapacity(),
                this->GetOffsetOfInlineSlots(),
                true,
                false);
        newTypeHandler->SetMayBecomeShared();

#if ENABLE_FIXED_FIELDS
#ifdef SUPPORT_FIXED_FIELDS_ON_PATH_TYPES
        Assert(HasSingletonInstanceOnlyIfNeeded());

        // If instance has a shared type, the type handler change below will induce a type transition, which
        // guarantees that any existing fast path field stores (which could quietly overwrite a fixed field
        // on this instance) will be invalidated.  It is safe to mark all fields as fixed.
        bool const allowFixedFields = DynamicTypeHandler::AreSingletonInstancesNeeded() && instance->HasLockedType();
#endif
#endif

        DynamicType *existingType = instance->GetDynamicType();
        DynamicType *currentType = DynamicType::New(scriptContext, existingType->GetTypeId(), existingType->GetPrototype(), nullptr, newTypeHandler, false, false);
        PropertyId propertyId = Constants::NoProperty;
        ObjectSlotAttributes attr = ObjectSlotAttr_None;
        for (PropertyIndex i = 0; i < propertyCount; i++)
        {
            propertyId = descriptors[i].Id->GetPropertyId();
            attr = PathTypeHandlerBase::PropertyAttributesToObjectSlotAttributes(descriptors[i].Attributes);
            PropertyIndex index;
            currentType = newTypeHandler->PromoteType<false>(currentType, PathTypeSuccessorKey(propertyId, attr), false, scriptContext, instance, &index);
            newTypeHandler = PathTypeHandlerBase::FromTypeHandler(currentType->GetTypeHandler());
#if ENABLE_FIXED_FIELDS
#ifdef SUPPORT_FIXED_FIELDS_ON_PATH_TYPES
            Var value = instance->GetSlot(i);
            bool markAsFixed = allowFixedFields && !IsInternalPropertyId(propertyId) && value != nullptr &&
                (VarIs<JavascriptFunction>(value) ? ShouldFixMethodProperties() : false);
            newTypeHandler->InitializePath(instance, i, newTypeHandler->GetPathLength(), scriptContext, [=]() { return markAsFixed; });
#endif
#endif
        }

        if (existingType->GetIsLocked())
        {
            newTypeHandler->LockTypeHandler();
        }
        if (existingType->GetIsShared())
        {
            newTypeHandler->ShareTypeHandler(scriptContext);
        }
        newTypeHandler->SetFlags(IsPrototypeFlag | HasKnownSlot0Flag, this->GetFlags());
        newTypeHandler->SetPropertyTypes(PropertyTypesWritableDataOnly | PropertyTypesWritableDataOnlyDetection | PropertyTypesHasSpecialProperties, this->GetPropertyTypes());
        newTypeHandler->SetInstanceTypeHandler(instance, false);
        if (newTypeHandler->GetPredecessorType())
        {
            PathTypeHandlerBase *predTypeHandler = PathTypeHandlerBase::FromTypeHandler(newTypeHandler->GetPredecessorType()->GetTypeHandler());
            predTypeHandler->ReplaceSuccessor(newTypeHandler->GetPredecessorType(), PathTypeSuccessorKey(propertyId, attr), scriptContext->GetRecycler()->CreateWeakReferenceHandle<DynamicType>(existingType));
        }

        return newTypeHandler;
    }